

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_dtor(LIBSSH2_SESSION *session,void **abstract)

{
  EC_KEY *keyctx;
  void **abstract_local;
  LIBSSH2_SESSION *session_local;
  
  if ((EC_KEY *)*abstract != (EC_KEY *)0x0) {
    EC_KEY_free((EC_KEY *)*abstract);
  }
  *abstract = (void *)0x0;
  return 0;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_dtor(LIBSSH2_SESSION * session, void **abstract)
{
    libssh2_ecdsa_ctx *keyctx = (libssh2_ecdsa_ctx *) (*abstract);
    (void)session;

    if(keyctx)
        _libssh2_ecdsa_free(keyctx);

    *abstract = NULL;

    return 0;
}